

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

void helper_mulsaq_s_l_pw_mips64el
               (target_ulong rs,target_ulong rt,uint32_t ac,CPUMIPSState_conflict5 *env)

{
  target_ulong *ptVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (rt >> 0x20 == 0x80000000 && rs >> 0x20 == 0x80000000) {
    ptVar1 = &(env->active_tc).DSPControl;
    *ptVar1 = *ptVar1 | 1L << ((char)ac + 0x10U & 0x3f);
    uVar5 = 0x7fffffffffffffff;
  }
  else {
    uVar5 = ((long)rs >> 0x1f & 0xfffffffffffffffeU) * ((long)rt >> 0x20);
  }
  if ((int)rt == -0x80000000 && (int)rs == -0x80000000) {
    ptVar1 = &(env->active_tc).DSPControl;
    *ptVar1 = *ptVar1 | 1L << ((char)ac + 0x10U & 0x3f);
    uVar3 = 0x7fffffffffffffff;
  }
  else {
    uVar3 = (long)(int)rs * (long)(int)rt * 2;
  }
  lVar4 = 0;
  if (uVar5 < uVar3) {
    lVar4 = -0x8000000000000000;
  }
  ptVar1 = (env->active_tc).LO + ac;
  uVar2 = *ptVar1;
  *ptVar1 = *ptVar1 + (uVar5 - uVar3);
  ptVar1 = (env->active_tc).HI + ac;
  *ptVar1 = *ptVar1 + ((long)((lVar4 + uVar5 & 0x8000000000000000) + uVar3) >> 0x3f) +
            (ulong)CARRY8(uVar2,uVar5 - uVar3);
  return;
}

Assistant:

void helper_mulsaq_s_l_pw(target_ulong rs, target_ulong rt, uint32_t ac,
                          CPUMIPSState *env)
{
    int32_t rs1, rs0;
    int32_t rt1, rt0;
    int64_t tempB[2], tempA[2];
    int64_t temp[2];
    int64_t acc[2];
    int64_t temp_sum;

    rs1 = (rs >> 32) & MIPSDSP_LLO;
    rs0 = rs & MIPSDSP_LLO;
    rt1 = (rt >> 32) & MIPSDSP_LLO;
    rt0 = rt & MIPSDSP_LLO;

    tempB[0] = mipsdsp_mul_q31_q31(ac, rs1, rt1, env);
    tempA[0] = mipsdsp_mul_q31_q31(ac, rs0, rt0, env);

    if (tempB[0] >= 0) {
        tempB[1] = 0x00;
    } else {
        tempB[1] = ~0ull;
    }

    if (tempA[0] >= 0) {
        tempA[1] = 0x00;
    } else {
        tempA[1] = ~0ull;
    }

    acc[0] = env->active_tc.LO[ac];
    acc[1] = env->active_tc.HI[ac];

    temp_sum = tempB[0] - tempA[0];
    if ((uint64_t)temp_sum > (uint64_t)tempB[0]) {
        tempB[1] -= 1;
    }
    temp[0] = temp_sum;
    temp[1] = tempB[1] - tempA[1];

    if ((temp[1] & 0x01) == 0) {
        temp[1] = 0x00;
    } else {
        temp[1] = ~0ull;
    }

    temp_sum = acc[0] + temp[0];
    if (((uint64_t)temp_sum < (uint64_t)acc[0]) &&
       ((uint64_t)temp_sum < (uint64_t)temp[0])) {
        acc[1] += 1;
    }
    acc[0] = temp_sum;
    acc[1] += temp[1];

    env->active_tc.HI[ac] = acc[1];
    env->active_tc.LO[ac] = acc[0];
}